

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lice.cc
# Opt level: O0

vector<SensorReading,_std::allocator<SensorReading>_> * __thiscall
P8Lice::getReadings(vector<SensorReading,_std::allocator<SensorReading>_> *__return_storage_ptr__,
                   P8Lice *this,time_t start_time,time_t stop_time)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  mapped_type *this_00;
  JSONArray *a;
  JSONValue *pJVar5;
  string *psVar6;
  longlong *plVar7;
  double *pdVar8;
  bool *pbVar9;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  allocator<char> local_671;
  string local_670;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  undefined1 local_330 [8];
  SensorReading toadd;
  int i;
  key_type local_270;
  undefined1 local_250 [8];
  JSONArray rows;
  allocator<char> local_219;
  string local_218;
  undefined1 local_1f8 [8];
  JSONObject reply;
  stringstream local_1b8 [8];
  stringstream keys;
  ostream local_1a8 [383];
  byte local_29;
  time_t local_28;
  time_t stop_time_local;
  time_t start_time_local;
  P8Lice *this_local;
  vector<SensorReading,_std::allocator<SensorReading>_> *ret;
  
  local_29 = 0;
  local_28 = stop_time;
  stop_time_local = start_time;
  start_time_local = (time_t)this;
  this_local = (P8Lice *)__return_storage_ptr__;
  std::vector<SensorReading,_std::allocator<SensorReading>_>::vector(__return_storage_ptr__);
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar4 = std::operator<<(local_1a8,"?startkey=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,stop_time_local);
  poVar4 = std::operator<<(poVar4,"000&endkey=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
  std::operator<<(poVar4,"000");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"_design/plotdata/_view/all",&local_219);
  std::__cxx11::stringstream::str();
  CouchDBInterface::getView
            ((JSONObject *)local_1f8,&this->interface,&local_218,(string *)&rows.n_elements);
  std::__cxx11::string::~string((string *)&rows.n_elements);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"rows",(allocator<char> *)((long)&i + 3));
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                          *)local_1f8,&local_270);
  a = JSON::JSONValue::getArrayValue(this_00);
  JSON::JSONArray::JSONArray((JSONArray *)local_250,a);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  iVar3 = JSON::JSONArray::length((JSONArray *)local_250);
  if (iVar3 != 0) {
    for (toadd.uncalibrated_units.field_2._12_4_ = 0;
        uVar1 = toadd.uncalibrated_units.field_2._12_4_,
        iVar3 = JSON::JSONArray::length((JSONArray *)local_250), (int)uVar1 < iVar3;
        toadd.uncalibrated_units.field_2._12_4_ = toadd.uncalibrated_units.field_2._12_4_ + 1) {
      SensorReading::SensorReading((SensorReading *)local_330);
      pJVar5 = JSON::JSONArray::operator[]
                         ((JSONArray *)local_250,
                          (int *)(toadd.uncalibrated_units.field_2._M_local_buf + 0xc));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"value",&local_351);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_350);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"sensor_name",&local_379);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_378);
      psVar6 = JSON::JSONValue::getStringValue_abi_cxx11_(pJVar5);
      std::__cxx11::string::operator=((string *)local_330,(string *)psVar6);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator(&local_379);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator(&local_351);
      pJVar5 = JSON::JSONArray::operator[]
                         ((JSONArray *)local_250,
                          (int *)(toadd.uncalibrated_units.field_2._M_local_buf + 0xc));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"value",&local_3a1);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_3a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c8,"timestamp_mseconds",&local_3c9);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_3c8);
      plVar7 = JSON::JSONValue::getIntValue(pJVar5);
      toadd.units.field_2._8_8_ = *plVar7;
      std::__cxx11::string::~string((string *)&local_3c8);
      std::allocator<char>::~allocator(&local_3c9);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::allocator<char>::~allocator(&local_3a1);
      toadd.timestamp_ms = (long)toadd.units.field_2._8_8_ / 1000;
      pJVar5 = JSON::JSONArray::operator[]
                         ((JSONArray *)local_250,
                          (int *)(toadd.uncalibrated_units.field_2._M_local_buf + 0xc));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"value",&local_3f1);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_3f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"units",&local_419);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_418);
      psVar6 = JSON::JSONValue::getStringValue_abi_cxx11_(pJVar5);
      std::__cxx11::string::operator=((string *)&toadd.precision,(string *)psVar6);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator(&local_419);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator(&local_3f1);
      pJVar5 = JSON::JSONArray::operator[]
                         ((JSONArray *)local_250,
                          (int *)(toadd.uncalibrated_units.field_2._M_local_buf + 0xc));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"value",&local_441);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_440);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"value",&local_469);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_468);
      pdVar8 = JSON::JSONValue::getDoubleValue(pJVar5);
      toadd.sensor_name.field_2._8_8_ = *pdVar8;
      std::__cxx11::string::~string((string *)&local_468);
      std::allocator<char>::~allocator(&local_469);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator(&local_441);
      pJVar5 = JSON::JSONArray::operator[]
                         ((JSONArray *)local_250,
                          (int *)(toadd.uncalibrated_units.field_2._M_local_buf + 0xc));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"value",&local_491);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_490);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b8,"uncalibrated_value",&local_4b9);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_4b8);
      bVar2 = JSON::JSONValue::isNull(pJVar5);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::allocator<char>::~allocator(&local_4b9);
      std::__cxx11::string::~string((string *)&local_490);
      std::allocator<char>::~allocator(&local_491);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pJVar5 = JSON::JSONArray::operator[]
                           ((JSONArray *)local_250,
                            (int *)(toadd.uncalibrated_units.field_2._M_local_buf + 0xc));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"value",&local_4e1);
        pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_4e0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_508,"uncalibrated_value",&local_509);
        pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_508);
        pdVar8 = JSON::JSONValue::getDoubleValue(pJVar5);
        toadd.error_value.field_2._8_8_ = *pdVar8;
        std::__cxx11::string::~string((string *)&local_508);
        std::allocator<char>::~allocator(&local_509);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::allocator<char>::~allocator(&local_4e1);
      }
      pJVar5 = JSON::JSONArray::operator[]
                         ((JSONArray *)local_250,
                          (int *)(toadd.uncalibrated_units.field_2._M_local_buf + 0xc));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"value",&local_531);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_530);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_558,"uncalibrated_units",&local_559);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_558);
      bVar2 = JSON::JSONValue::isNull(pJVar5);
      std::__cxx11::string::~string((string *)&local_558);
      std::allocator<char>::~allocator(&local_559);
      std::__cxx11::string::~string((string *)&local_530);
      std::allocator<char>::~allocator(&local_531);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pJVar5 = JSON::JSONArray::operator[]
                           ((JSONArray *)local_250,
                            (int *)(toadd.uncalibrated_units.field_2._M_local_buf + 0xc));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"value",&local_581);
        pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_580);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5a8,"uncalibrated_units",&local_5a9);
        pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_5a8);
        psVar6 = JSON::JSONValue::getStringValue_abi_cxx11_(pJVar5);
        std::__cxx11::string::operator=((string *)&toadd.uncalibrated_value,(string *)psVar6);
        std::__cxx11::string::~string((string *)&local_5a8);
        std::allocator<char>::~allocator(&local_5a9);
        std::__cxx11::string::~string((string *)&local_580);
        std::allocator<char>::~allocator(&local_581);
      }
      pJVar5 = JSON::JSONArray::operator[]
                         ((JSONArray *)local_250,
                          (int *)(toadd.uncalibrated_units.field_2._M_local_buf + 0xc));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"value",&local_5d1);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_5d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5f8,"precision",&local_5f9);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_5f8);
      bVar2 = JSON::JSONValue::isNull(pJVar5);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::allocator<char>::~allocator(&local_5f9);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::allocator<char>::~allocator(&local_5d1);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pJVar5 = JSON::JSONArray::operator[]
                           ((JSONArray *)local_250,
                            (int *)(toadd.uncalibrated_units.field_2._M_local_buf + 0xc));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"value",&local_621);
        pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_620);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_648,"precision",&local_649);
        pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_648);
        plVar7 = JSON::JSONValue::getIntValue(pJVar5);
        toadd.value._0_4_ = (undefined4)*plVar7;
        std::__cxx11::string::~string((string *)&local_648);
        std::allocator<char>::~allocator(&local_649);
        std::__cxx11::string::~string((string *)&local_620);
        std::allocator<char>::~allocator(&local_621);
      }
      pJVar5 = JSON::JSONArray::operator[]
                         ((JSONArray *)local_250,
                          (int *)(toadd.uncalibrated_units.field_2._M_local_buf + 0xc));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"value",&local_671);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_670);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_698,"has_error",&local_699);
      pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_698);
      bVar2 = JSON::JSONValue::isNull(pJVar5);
      std::__cxx11::string::~string((string *)&local_698);
      std::allocator<char>::~allocator(&local_699);
      std::__cxx11::string::~string((string *)&local_670);
      std::allocator<char>::~allocator(&local_671);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        toadd.timestamp._0_1_ = 0;
      }
      else {
        pJVar5 = JSON::JSONArray::operator[]
                           ((JSONArray *)local_250,
                            (int *)(toadd.uncalibrated_units.field_2._M_local_buf + 0xc));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0,"value",&local_6c1);
        pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_6c0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6e8,"has_error",&local_6e9);
        pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_6e8);
        pbVar9 = JSON::JSONValue::getBoolValue(pJVar5);
        toadd.timestamp._0_1_ = *pbVar9 & 1;
        std::__cxx11::string::~string((string *)&local_6e8);
        std::allocator<char>::~allocator(&local_6e9);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::allocator<char>::~allocator(&local_6c1);
      }
      if (((byte)toadd.timestamp & 1) != 0) {
        pJVar5 = JSON::JSONArray::operator[]
                           ((JSONArray *)local_250,
                            (int *)(toadd.uncalibrated_units.field_2._M_local_buf + 0xc));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"value",&local_711);
        pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_710);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_738,"error_value",&local_739);
        pJVar5 = JSON::JSONValue::operator[](pJVar5,&local_738);
        psVar6 = JSON::JSONValue::getStringValue_abi_cxx11_(pJVar5);
        std::__cxx11::string::operator=((string *)&toadd.has_error,(string *)psVar6);
        std::__cxx11::string::~string((string *)&local_738);
        std::allocator<char>::~allocator(&local_739);
        std::__cxx11::string::~string((string *)&local_710);
        std::allocator<char>::~allocator(&local_711);
      }
      std::vector<SensorReading,_std::allocator<SensorReading>_>::push_back
                (__return_storage_ptr__,(value_type *)local_330);
      SensorReading::~SensorReading((SensorReading *)local_330);
    }
  }
  local_29 = 1;
  JSON::JSONArray::~JSONArray((JSONArray *)local_250);
  JSON::JSONObject::~JSONObject((JSONObject *)local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  if ((local_29 & 1) == 0) {
    std::vector<SensorReading,_std::allocator<SensorReading>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<SensorReading> P8Lice::getReadings(time_t start_time, time_t stop_time) {
	vector<SensorReading> ret;
	stringstream keys;
	keys << "?startkey=" << start_time << "000&endkey=" << stop_time << "000";
	JSONObject reply=interface.getView("_design/plotdata/_view/all",keys.str());
	JSONArray rows=reply["rows"].getArrayValue();
	if(rows.length()==0)
		return ret;
	for(int i=0;i<rows.length();i++) {
		SensorReading toadd;
		toadd.sensor_name=rows[i]["value"]["sensor_name"].getStringValue();
		toadd.timestamp_ms=rows[i]["value"]["timestamp_mseconds"].getIntValue();
		toadd.timestamp=(toadd.timestamp_ms)/1000;
		toadd.units=rows[i]["value"]["units"].getStringValue();
		toadd.value=rows[i]["value"]["value"].getDoubleValue();
		if(!rows[i]["value"]["uncalibrated_value"].isNull())
			toadd.uncalibrated_value=rows[i]["value"]["uncalibrated_value"].getDoubleValue();
		if(!rows[i]["value"]["uncalibrated_units"].isNull())
			toadd.uncalibrated_units=rows[i]["value"]["uncalibrated_units"].getStringValue();
		if(!rows[i]["value"]["precision"].isNull())
			toadd.precision=rows[i]["value"]["precision"].getIntValue();
		if(!rows[i]["value"]["has_error"].isNull())
			toadd.has_error=rows[i]["value"]["has_error"].getBoolValue();
		else
			toadd.has_error=false;
		if(toadd.has_error)
			toadd.error_value=rows[i]["value"]["error_value"].getStringValue();
		ret.push_back(toadd);
	}
	return ret;
}